

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O0

void __thiscall ASN1Test_SetTime_Test::TestBody(ASN1Test_SetTime_Test *this)

{
  bool bVar1;
  ASN1_UTCTIME *__p;
  char *pcVar2;
  pointer paVar3;
  ASN1_GENERALIZEDTIME *__p_00;
  ASN1_TIME *__p_01;
  char *in_R9;
  string_view sVar4;
  string local_618;
  AssertHelper local_5f8;
  Message local_5f0;
  bool local_5e1;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar__8;
  Message local_5c8;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_17;
  Message local_5a8;
  int local_5a0;
  int local_59c;
  undefined1 local_598 [8];
  AssertionResult gtest_ar_16;
  AssertHelper local_568;
  Message local_560;
  bool local_551;
  undefined1 local_550 [8];
  AssertionResult gtest_ar__7;
  Message local_538;
  string_view local_530;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_15;
  Message local_508;
  int local_500 [2];
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_14;
  Message local_4e0;
  string_view local_4d8;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_13;
  Message local_4b0;
  int local_4a8 [2];
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_470;
  Message local_468;
  undefined1 local_460 [8];
  AssertionResult gtest_ar__6;
  UniquePtr<ASN1_TIME> choice;
  AssertHelper local_428;
  Message local_420;
  bool local_411;
  undefined1 local_410 [8];
  AssertionResult gtest_ar__5;
  Message local_3f8;
  string local_3f0;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_11;
  Message local_3b8;
  string local_3b0;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_10;
  Message local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_9;
  Message local_358;
  int local_350;
  int local_34c;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_318;
  Message local_310;
  bool local_301;
  undefined1 local_300 [8];
  AssertionResult gtest_ar__4;
  Message local_2e8;
  string_view local_2e0;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_7;
  Message local_2b8;
  int local_2b0 [2];
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_278;
  Message local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<ASN1_GENERALIZEDTIME> generalized;
  AssertHelper local_230;
  Message local_228;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__2;
  Message local_200;
  string local_1f8;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_5;
  Message local_1c0;
  string local_1b8;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_4;
  Message local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_3;
  Message local_160;
  int local_158;
  int local_154;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_120;
  Message local_118;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__1;
  Message local_f0;
  string_view local_e8;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  Message local_c0;
  int local_b8 [2];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  unique_ptr<asn1_string_st,_bssl::internal::Deleter> local_48;
  UniquePtr<ASN1_UTCTIME> utc;
  ScopedTrace gtest_trace_1014;
  int64_t tt;
  anon_struct_32_4_837a7bc6 *t;
  anon_struct_32_4_837a7bc6 *__end1;
  anon_struct_32_4_837a7bc6 *__begin1;
  anon_struct_32_4_837a7bc6 (*__range1) [13];
  ASN1Test_SetTime_Test *this_local;
  
  __end1 = TestBody::kTests;
  do {
    if ((ASN1_TEMPLATE *)__end1 == ASN1_LINKED_LIST_seq_tt) {
      return;
    }
    testing::ScopedTrace::ScopedTrace<long>
              ((ScopedTrace *)
               ((long)&utc._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x3f6,&__end1->time);
    __p = ASN1_UTCTIME_set((ASN1_UTCTIME *)0x0,__end1->time);
    std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&local_48,(pointer)__p);
    if (__end1->utc == (char *)0x0) {
      local_219 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_48);
      local_219 = !local_219;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_218,&local_219,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
      if (!bVar1) {
        testing::Message::Message(&local_228);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&generalized,(internal *)local_218,(AssertionResult *)0x81d7fb,"true",
                   "false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x403,pcVar2);
        testing::internal::AssertHelper::operator=(&local_230,&local_228);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        std::__cxx11::string::~string((string *)&generalized);
        testing::Message::~Message(&local_228);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
LAB_001e3423:
      __p_00 = ASN1_GENERALIZEDTIME_set((ASN1_GENERALIZEDTIME *)0x0,__end1->time);
      std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&gtest_ar__3.message_,
                 (pointer)__p_00);
      if (__end1->generalized == (char *)0x0) {
        local_411 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&gtest_ar__3.message_);
        local_411 = !local_411;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_410,&local_411,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
        if (!bVar1) {
          testing::Message::Message(&local_420);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&choice,(internal *)local_410,(AssertionResult *)0x81d905,"true",
                     "false",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_428,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x415,pcVar2);
          testing::internal::AssertHelper::operator=(&local_428,&local_420);
          testing::internal::AssertHelper::~AssertHelper(&local_428);
          std::__cxx11::string::~string((string *)&choice);
          testing::Message::~Message(&local_420);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
LAB_001e4142:
        __p_01 = ASN1_TIME_set_posix((ASN1_TIME *)0x0,__end1->time);
        std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&gtest_ar__6.message_,
                   __p_01);
        if (__end1->generalized == (char *)0x0) {
          local_5e1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&gtest_ar__6.message_);
          local_5e1 = !local_5e1;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_5e0,&local_5e1,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
          if (!bVar1) {
            testing::Message::Message(&local_5f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_618,(internal *)local_5e0,(AssertionResult *)0x81fe22,"true","false",
                       in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_5f8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x426,pcVar2);
            testing::internal::AssertHelper::operator=(&local_5f8,&local_5f0);
            testing::internal::AssertHelper::~AssertHelper(&local_5f8);
            std::__cxx11::string::~string((string *)&local_618);
            testing::Message::~Message(&local_5f0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
LAB_001e4e56:
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
        else {
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<asn1_string_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_460,
                     (unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
          if (!bVar1) {
            testing::Message::Message(&local_468);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_12.message_,(internal *)local_460,
                       (AssertionResult *)0x81fe22,"false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_470,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x41a,pcVar2);
            testing::internal::AssertHelper::operator=(&local_470,&local_468);
            testing::internal::AssertHelper::~AssertHelper(&local_470);
            std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
            testing::Message::~Message(&local_468);
          }
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
          if (gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            if (__end1->utc == (char *)0x0) {
              local_500[1] = 0x18;
              paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__6.message_);
              local_500[0] = ASN1_STRING_type((ASN1_STRING *)paVar3);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_4f8,"24","ASN1_STRING_type(choice.get())",local_500 + 1,
                         local_500);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
              if (!bVar1) {
                testing::Message::Message(&local_508);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x41f,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_15.message_,&local_508);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_15.message_);
                testing::Message::~Message(&local_508);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
              paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__6.message_);
              sVar4 = ASN1StringToStringView(paVar3);
              local_530 = sVar4;
              testing::internal::EqHelper::
              Compare<const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                        ((EqHelper *)local_520,"t.generalized",
                         "ASN1StringToStringView(choice.get())",&__end1->generalized,&local_530);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
              if (!bVar1) {
                testing::Message::Message(&local_538);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x420,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__7.message_,&local_538);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_538);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
            }
            else {
              local_4a8[1] = 0x17;
              paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__6.message_);
              local_4a8[0] = ASN1_STRING_type((ASN1_STRING *)paVar3);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_4a0,"23","ASN1_STRING_type(choice.get())",local_4a8 + 1,
                         local_4a8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
              if (!bVar1) {
                testing::Message::Message(&local_4b0);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x41c,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_13.message_,&local_4b0);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_13.message_);
                testing::Message::~Message(&local_4b0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
              paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__6.message_);
              sVar4 = ASN1StringToStringView(paVar3);
              local_4d8 = sVar4;
              testing::internal::EqHelper::
              Compare<const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                        ((EqHelper *)local_4c8,"t.utc","ASN1StringToStringView(choice.get())",
                         &__end1->utc,&local_4d8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
              if (!bVar1) {
                testing::Message::Message(&local_4e0);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x41d,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_14.message_,&local_4e0);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_14.message_);
                testing::Message::~Message(&local_4e0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
            }
            paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                &gtest_ar__6.message_);
            local_551 = ASN1Time_check_posix(paVar3,__end1->time);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_550,&local_551,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
            if (!bVar1) {
              testing::Message::Message(&local_560);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_16.message_,(internal *)local_550,
                         (AssertionResult *)"ASN1Time_check_posix(choice.get(), t.time)","false",
                         "true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_568,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x422,pcVar2);
              testing::internal::AssertHelper::operator=(&local_568,&local_560);
              testing::internal::AssertHelper::~AssertHelper(&local_568);
              std::__cxx11::string::~string((string *)&gtest_ar_16.message_);
              testing::Message::~Message(&local_560);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
            paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                &gtest_ar__6.message_);
            local_59c = ASN1_TIME_to_posix(paVar3,(int64_t *)&stack0xffffffffffffffc8);
            local_5a0 = 1;
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_598,"ASN1_TIME_to_posix(choice.get(), &tt)","1",&local_59c,
                       &local_5a0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_598);
            if (!bVar1) {
              testing::Message::Message(&local_5a8);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_598);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x423,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_17.message_,&local_5a8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
              testing::Message::~Message(&local_5a8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_598);
            testing::internal::EqHelper::Compare<long,_long,_nullptr>
                      ((EqHelper *)local_5c0,"tt","t.time",(long *)&stack0xffffffffffffffc8,
                       &__end1->time);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
            if (!bVar1) {
              testing::Message::Message(&local_5c8);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x424,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__8.message_,&local_5c8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8.message_);
              testing::Message::~Message(&local_5c8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
            goto LAB_001e4e56;
          }
        }
        std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_);
      }
      else {
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<asn1_string_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_268,
                   (unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   (type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
        if (!bVar1) {
          testing::Message::Message(&local_270);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_6.message_,(internal *)local_268,
                     (AssertionResult *)0x81d905,"false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_278,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x409,pcVar2);
          testing::internal::AssertHelper::operator=(&local_278,&local_270);
          testing::internal::AssertHelper::~AssertHelper(&local_278);
          std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_270);
        }
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_2b0[1] = 0x18;
          paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                              &gtest_ar__3.message_);
          local_2b0[0] = ASN1_STRING_type((ASN1_STRING *)paVar3);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_2a8,"24","ASN1_STRING_type(generalized.get())",local_2b0 + 1,
                     local_2b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
          if (!bVar1) {
            testing::Message::Message(&local_2b8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x40a,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_7.message_,&local_2b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
            testing::Message::~Message(&local_2b8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
          paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                              &gtest_ar__3.message_);
          sVar4 = ASN1StringToStringView(paVar3);
          local_2e0 = sVar4;
          testing::internal::EqHelper::
          Compare<const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                    ((EqHelper *)local_2d0,"t.generalized",
                     "ASN1StringToStringView(generalized.get())",&__end1->generalized,&local_2e0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
          if (!bVar1) {
            testing::Message::Message(&local_2e8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x40b,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__4.message_,&local_2e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_2e8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
          paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                              &gtest_ar__3.message_);
          local_301 = ASN1Time_check_posix(paVar3,__end1->time);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_300,&local_301,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
          if (!bVar1) {
            testing::Message::Message(&local_310);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_8.message_,(internal *)local_300,
                       (AssertionResult *)"ASN1Time_check_posix(generalized.get(), t.time)","false",
                       "true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_318,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x40c,pcVar2);
            testing::internal::AssertHelper::operator=(&local_318,&local_310);
            testing::internal::AssertHelper::~AssertHelper(&local_318);
            std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
            testing::Message::~Message(&local_310);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
          paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                              &gtest_ar__3.message_);
          local_34c = ASN1_TIME_to_posix(paVar3,(int64_t *)&stack0xffffffffffffffc8);
          local_350 = 1;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_348,"ASN1_TIME_to_posix(generalized.get(), &tt)","1",
                     &local_34c,&local_350);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
          if (!bVar1) {
            testing::Message::Message(&local_358);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x40d,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_9.message_,&local_358);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
            testing::Message::~Message(&local_358);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
          testing::internal::EqHelper::Compare<long,_long,_nullptr>
                    ((EqHelper *)local_370,"tt","t.time",(long *)&stack0xffffffffffffffc8,
                     &__end1->time);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
          if (!bVar1) {
            testing::Message::Message(&local_378);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x40e,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_10.message_,&local_378);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
            testing::Message::~Message(&local_378);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
          paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                              &gtest_ar__3.message_);
          PrintStringToBIO_abi_cxx11_(&local_3b0,paVar3,ASN1_GENERALIZEDTIME_print);
          testing::internal::EqHelper::
          Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_nullptr>
                    ((EqHelper *)local_390,
                     "PrintStringToBIO(generalized.get(), &ASN1_GENERALIZEDTIME_print)","t.printed",
                     &local_3b0,&__end1->printed);
          std::__cxx11::string::~string((string *)&local_3b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
          if (!bVar1) {
            testing::Message::Message(&local_3b8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x411,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_11.message_,&local_3b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
            testing::Message::~Message(&local_3b8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
          paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                              &gtest_ar__3.message_);
          PrintStringToBIO_abi_cxx11_(&local_3f0,paVar3,ASN1_TIME_print);
          testing::internal::EqHelper::
          Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_nullptr>
                    ((EqHelper *)local_3d0,"PrintStringToBIO(generalized.get(), &ASN1_TIME_print)",
                     "t.printed",&local_3f0,&__end1->printed);
          std::__cxx11::string::~string((string *)&local_3f0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
          if (!bVar1) {
            testing::Message::Message(&local_3f8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x413,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__5.message_,&local_3f8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_3f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
          goto LAB_001e4142;
        }
      }
      std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
    }
    else {
      testing::AssertionResult::
      AssertionResult<std::unique_ptr<asn1_string_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_68,&local_48,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
      if (!bVar1) {
        testing::Message::Message(&local_70);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_98,(internal *)local_68,(AssertionResult *)0x81d7fb,"false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x3fa,pcVar2);
        testing::internal::AssertHelper::operator=(&local_78,&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        std::__cxx11::string::~string((string *)&local_98);
        testing::Message::~Message(&local_70);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_b8[1] = 0x17;
        paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get(&local_48);
        local_b8[0] = ASN1_STRING_type((ASN1_STRING *)paVar3);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_b0,"23","ASN1_STRING_type(utc.get())",local_b8 + 1,local_b8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
        if (!bVar1) {
          testing::Message::Message(&local_c0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x3fb,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_c0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
          testing::Message::~Message(&local_c0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
        paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get(&local_48);
        sVar4 = ASN1StringToStringView(paVar3);
        local_e8 = sVar4;
        testing::internal::EqHelper::
        Compare<const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                  ((EqHelper *)local_d8,"t.utc","ASN1StringToStringView(utc.get())",&__end1->utc,
                   &local_e8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
        if (!bVar1) {
          testing::Message::Message(&local_f0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x3fc,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__1.message_,&local_f0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
          testing::Message::~Message(&local_f0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
        paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get(&local_48);
        local_109 = ASN1Time_check_posix(paVar3,__end1->time);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_108,&local_109,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
        if (!bVar1) {
          testing::Message::Message(&local_118);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_2.message_,(internal *)local_108,
                     (AssertionResult *)"ASN1Time_check_posix(utc.get(), t.time)","false","true",
                     in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_120,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x3fd,pcVar2);
          testing::internal::AssertHelper::operator=(&local_120,&local_118);
          testing::internal::AssertHelper::~AssertHelper(&local_120);
          std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_118);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
        paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get(&local_48);
        local_154 = ASN1_TIME_to_posix(paVar3,(int64_t *)&stack0xffffffffffffffc8);
        local_158 = 1;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_150,"ASN1_TIME_to_posix(utc.get(), &tt)","1",&local_154,
                   &local_158);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
        if (!bVar1) {
          testing::Message::Message(&local_160);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x3fe,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_160);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_160);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
        testing::internal::EqHelper::Compare<long,_long,_nullptr>
                  ((EqHelper *)local_178,"tt","t.time",(long *)&stack0xffffffffffffffc8,
                   &__end1->time);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
        if (!bVar1) {
          testing::Message::Message(&local_180);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x3ff,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_180);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_180);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
        paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get(&local_48);
        PrintStringToBIO_abi_cxx11_(&local_1b8,paVar3,ASN1_UTCTIME_print);
        testing::internal::EqHelper::
        Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_nullptr>
                  ((EqHelper *)local_198,"PrintStringToBIO(utc.get(), &ASN1_UTCTIME_print)",
                   "t.printed",&local_1b8,&__end1->printed);
        std::__cxx11::string::~string((string *)&local_1b8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
        if (!bVar1) {
          testing::Message::Message(&local_1c0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x400,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_5.message_,&local_1c0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
          testing::Message::~Message(&local_1c0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
        paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get(&local_48);
        PrintStringToBIO_abi_cxx11_(&local_1f8,paVar3,ASN1_TIME_print);
        testing::internal::EqHelper::
        Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_nullptr>
                  ((EqHelper *)local_1d8,"PrintStringToBIO(utc.get(), &ASN1_TIME_print)","t.printed"
                   ,&local_1f8,&__end1->printed);
        std::__cxx11::string::~string((string *)&local_1f8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
        if (!bVar1) {
          testing::Message::Message(&local_200);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x401,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__2.message_,&local_200);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
          testing::Message::~Message(&local_200);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
        goto LAB_001e3423;
      }
    }
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&local_48);
    testing::ScopedTrace::~ScopedTrace
              ((ScopedTrace *)
               ((long)&utc._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl + 7));
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) {
      return;
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

TEST(ASN1Test, SetTime) {
  static const struct {
    int64_t time;
    const char *generalized;
    const char *utc;
    const char *printed;
  } kTests[] = {
      {-631152001, "19491231235959Z", nullptr, "Dec 31 23:59:59 1949 GMT"},
      {-631152000, "19500101000000Z", "500101000000Z",
       "Jan  1 00:00:00 1950 GMT"},
      {0, "19700101000000Z", "700101000000Z", "Jan  1 00:00:00 1970 GMT"},
      {981173106, "20010203040506Z", "010203040506Z",
       "Feb  3 04:05:06 2001 GMT"},
      {951804000, "20000229060000Z", "000229060000Z",
       "Feb 29 06:00:00 2000 GMT"},
      // NASA says this is the correct time for posterity.
      {-16751025, "19690621025615Z", "690621025615Z",
       "Jun 21 02:56:15 1969 GMT"},
      // -1 is sometimes used as an error value. Ensure we correctly handle it.
      {-1, "19691231235959Z", "691231235959Z", "Dec 31 23:59:59 1969 GMT"},
      {2524607999, "20491231235959Z", "491231235959Z",
       "Dec 31 23:59:59 2049 GMT"},
      {2524608000, "20500101000000Z", nullptr, "Jan  1 00:00:00 2050 GMT"},
      // Test boundary conditions.
      {-62167219200, "00000101000000Z", nullptr, "Jan  1 00:00:00 0 GMT"},
      {-62167219201, nullptr, nullptr, nullptr},
      {253402300799, "99991231235959Z", nullptr, "Dec 31 23:59:59 9999 GMT"},
      {253402300800, nullptr, nullptr, nullptr},
  };
  for (const auto &t : kTests) {
    int64_t tt;
    SCOPED_TRACE(t.time);

    bssl::UniquePtr<ASN1_UTCTIME> utc(ASN1_UTCTIME_set(nullptr, t.time));
    if (t.utc) {
      ASSERT_TRUE(utc);
      EXPECT_EQ(V_ASN1_UTCTIME, ASN1_STRING_type(utc.get()));
      EXPECT_EQ(t.utc, ASN1StringToStringView(utc.get()));
      EXPECT_TRUE(ASN1Time_check_posix(utc.get(), t.time));
      EXPECT_EQ(ASN1_TIME_to_posix(utc.get(), &tt), 1);
      EXPECT_EQ(tt, t.time);
      EXPECT_EQ(PrintStringToBIO(utc.get(), &ASN1_UTCTIME_print), t.printed);
      EXPECT_EQ(PrintStringToBIO(utc.get(), &ASN1_TIME_print), t.printed);
    } else {
      EXPECT_FALSE(utc);
    }

    bssl::UniquePtr<ASN1_GENERALIZEDTIME> generalized(
        ASN1_GENERALIZEDTIME_set(nullptr, t.time));
    if (t.generalized) {
      ASSERT_TRUE(generalized);
      EXPECT_EQ(V_ASN1_GENERALIZEDTIME, ASN1_STRING_type(generalized.get()));
      EXPECT_EQ(t.generalized, ASN1StringToStringView(generalized.get()));
      EXPECT_TRUE(ASN1Time_check_posix(generalized.get(), t.time));
      EXPECT_EQ(ASN1_TIME_to_posix(generalized.get(), &tt), 1);
      EXPECT_EQ(tt, t.time);
      EXPECT_EQ(
          PrintStringToBIO(generalized.get(), &ASN1_GENERALIZEDTIME_print),
          t.printed);
      EXPECT_EQ(PrintStringToBIO(generalized.get(), &ASN1_TIME_print),
                t.printed);
    } else {
      EXPECT_FALSE(generalized);
    }

    bssl::UniquePtr<ASN1_TIME> choice(ASN1_TIME_set_posix(nullptr, t.time));
    if (t.generalized) {
      ASSERT_TRUE(choice);
      if (t.utc) {
        EXPECT_EQ(V_ASN1_UTCTIME, ASN1_STRING_type(choice.get()));
        EXPECT_EQ(t.utc, ASN1StringToStringView(choice.get()));
      } else {
        EXPECT_EQ(V_ASN1_GENERALIZEDTIME, ASN1_STRING_type(choice.get()));
        EXPECT_EQ(t.generalized, ASN1StringToStringView(choice.get()));
      }
      EXPECT_TRUE(ASN1Time_check_posix(choice.get(), t.time));
      EXPECT_EQ(ASN1_TIME_to_posix(choice.get(), &tt), 1);
      EXPECT_EQ(tt, t.time);
    } else {
      EXPECT_FALSE(choice);
    }
  }
}